

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableObject::Equals
          (RecyclableObject *this,Var aRight,BOOL *value,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int32 iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  long lVar8;
  long lVar9;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  JavascriptBoolean *pJVar14;
  JavascriptSymbolObject *pJVar15;
  Var pvVar16;
  JavascriptSymbol *pJVar17;
  PropertyRecord *pPVar18;
  PropertyRecord *pPVar19;
  Type *pTVar20;
  double dVar21;
  double local_158;
  bool local_149;
  unsigned_long rightValue_7;
  unsigned_long leftValue_7;
  long rightValue_6;
  unsigned_long leftValue_6;
  long rightValue_5;
  unsigned_long leftValue_5;
  unsigned_long rightValue_4;
  long leftValue_4;
  long rightValue_3;
  long leftValue_3;
  int rightValue_2;
  long leftValue_2;
  unsigned_long rightValue_1;
  long leftValue_1;
  long rightValue;
  int leftValue;
  int redoCount;
  TypeId rightType;
  TypeId leftType;
  double dblRight;
  double dblLeft;
  Var aLeft;
  ScriptContext *requestContext_local;
  BOOL *value_local;
  Var aRight_local;
  RecyclableObject *this_local;
  TypeId local_48;
  TypeId typeId_2;
  TypeId local_30;
  TypeId typeId_1;
  TypeId local_18;
  TypeId typeId;
  
  if (this == (RecyclableObject *)aRight) {
    *value = 1;
    return 1;
  }
  redoCount = GetTypeId(this);
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is(aRight);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aRight);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = GetTypeId(pRVar7);
      if ((0x57 < (int)local_18) && (BVar3 = IsExternal(pRVar7), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  leftValue = local_18;
  rightValue._4_4_ = 0;
  dblLeft = (double)this;
  value_local = (BOOL *)aRight;
LAB_014365bf:
  if (rightValue._4_4_ == 2) {
LAB_01437560:
    *value = 0;
    return 1;
  }
  switch(redoCount) {
  case 0:
  case 1:
    if ((uint)leftValue < 2) {
      *value = 1;
      return 1;
    }
    if ((1 < leftValue - 3U) && (leftValue != 8)) {
      pRVar7 = VarTo<Js::RecyclableObject>(value_local);
      pTVar20 = GetType(pRVar7);
      BVar3 = Js::Type::IsFalsy(pTVar20);
      *value = BVar3;
      return 1;
    }
    goto LAB_01437560;
  case 2:
    if (1 < (uint)leftValue) {
      if (leftValue == 2) {
        pJVar14 = VarTo<Js::JavascriptBoolean>((Var)dblLeft);
        BVar3 = JavascriptBoolean::GetValue(pJVar14);
        pJVar14 = VarTo<Js::JavascriptBoolean>(value_local);
        BVar5 = JavascriptBoolean::GetValue(pJVar14);
        *value = (uint)(BVar3 == BVar5);
        return 1;
      }
      if ((leftValue - 3U < 2) || (leftValue == 7)) {
        dblRight = JavascriptConversion::ToNumber((Var)dblLeft,requestContext);
        _rightType = JavascriptConversion::ToNumber(value_local,requestContext);
        goto LAB_01437533;
      }
      goto joined_r0x01436d97;
    }
    goto LAB_01437560;
  case 3:
    switch(leftValue) {
    case 0:
    case 1:
    case 8:
      goto LAB_01437560;
    case 2:
    case 7:
      dblRight = TaggedInt::ToDouble((Var)dblLeft);
      _rightType = JavascriptConversion::ToNumber(value_local,requestContext);
      break;
    case 3:
      *value = (uint)((BOOL *)dblLeft == value_local);
      return 1;
    case 4:
      dblRight = TaggedInt::ToDouble((Var)dblLeft);
      _rightType = JavascriptNumber::GetValue(value_local);
      break;
    case 5:
      iVar4 = TaggedInt::ToInt32((Var)dblLeft);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(value_local);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      *value = (uint)(iVar4 == lVar8);
      if (*value == 0) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x23b,"(!(*value))","!(*value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    case 6:
      iVar4 = TaggedInt::ToInt32((Var)dblLeft);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(value_local);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      *value = (uint)(iVar4 == lVar8);
      if (*value == 0) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x244,"(!(*value))","!(*value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    default:
      goto switchD_0143668e_default;
    }
    goto LAB_01437533;
  case 4:
    switch(leftValue) {
    case 0:
    case 1:
    case 8:
      goto LAB_01437560;
    case 2:
    case 7:
      dblRight = JavascriptNumber::GetValue((Var)dblLeft);
      _rightType = JavascriptConversion::ToNumber(value_local,requestContext);
      break;
    case 3:
      dblRight = JavascriptNumber::GetValue((Var)dblLeft);
      _rightType = TaggedInt::ToDouble(value_local);
      break;
    case 4:
      dblRight = JavascriptNumber::GetValue((Var)dblLeft);
      _rightType = JavascriptNumber::GetValue(value_local);
      break;
    default:
      goto switchD_0143668e_default;
    }
LAB_01437533:
    *value = (uint)(dblRight == _rightType);
    return 1;
  case 5:
    switch(leftValue) {
    case 3:
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>((Var)dblLeft);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      iVar4 = TaggedInt::ToInt32(value_local);
      *value = (uint)(lVar8 == iVar4);
      if (*value == 0) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x25c,"(!(*value))","!(*value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    case 4:
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>((Var)dblLeft);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      dblRight = (double)lVar8;
      _rightType = JavascriptNumber::GetValue(value_local);
      goto LAB_01437533;
    case 5:
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>((Var)dblLeft);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(value_local);
      lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      *value = (uint)(lVar8 == lVar9);
      return 1;
    case 6:
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>((Var)dblLeft);
      lVar8 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(value_local);
      lVar9 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      *value = (uint)(lVar8 == lVar9);
      return 1;
    }
    break;
  case 6:
    switch(leftValue) {
    case 3:
      pJVar11 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>((Var)dblLeft);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      iVar4 = TaggedInt::ToInt32(value_local);
      local_149 = -1 < (long)iVar4 && uVar12 == (long)iVar4;
      *value = (uint)local_149;
      if (*value == 0) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x27d,"(!(*value))","!(*value)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    case 4:
      pJVar11 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>((Var)dblLeft);
      uVar13 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      uVar12 = uVar13;
      if ((long)uVar13 < 0) {
        uVar12 = (ulong)((uint)uVar13 & 1) | uVar13 >> 1;
      }
      dVar21 = (double)(long)uVar12;
      local_158 = dVar21 + dVar21;
      if ((long)uVar13 >= 0) {
        local_158 = dVar21;
      }
      dblRight = local_158;
      _rightType = JavascriptNumber::GetValue(value_local);
      goto LAB_01437533;
    case 5:
      pJVar11 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>((Var)dblLeft);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(value_local);
      uVar13 = JavascriptTypedNumber<long>::GetValue(pJVar10);
      *value = (uint)(uVar12 == uVar13);
      return 1;
    case 6:
      pJVar11 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>((Var)dblLeft);
      uVar12 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      pJVar11 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(value_local);
      uVar13 = JavascriptTypedNumber<unsigned_long>::GetValue(pJVar11);
      *value = (uint)(uVar12 == uVar13);
      return 1;
    }
    break;
  case 7:
    if ((uint)leftValue < 2) goto LAB_01437560;
    if (leftValue - 2U < 3) {
      dblRight = JavascriptConversion::ToNumber((Var)dblLeft,requestContext);
      _rightType = JavascriptConversion::ToNumber(value_local,requestContext);
      goto LAB_01437533;
    }
    if (leftValue == 7) {
      aLeft_00 = UnsafeVarTo<Js::JavascriptString>((Var)dblLeft);
      aRight_00 = UnsafeVarTo<Js::JavascriptString>(value_local);
      bVar2 = JavascriptString::Equals(aLeft_00,aRight_00);
      *value = (uint)bVar2;
      return 1;
    }
joined_r0x01436d97:
    if (leftValue == 8) goto LAB_01437560;
switchD_0143668e_default:
    value_local = (BOOL *)JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>
                                    (value_local,requestContext);
    if (value_local == (BOOL *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = TaggedInt::Is(value_local);
    if (bVar2) {
      local_48 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(value_local);
      if (bVar2) {
        local_48 = TypeIds_Number;
      }
      else {
        pRVar7 = UnsafeVarTo<Js::RecyclableObject>(value_local);
        if (pRVar7 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        local_48 = GetTypeId(pRVar7);
        if ((0x57 < (int)local_48) && (BVar3 = IsExternal(pRVar7), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    leftValue = local_48;
    rightValue._4_4_ = rightValue._4_4_ + 1;
    goto LAB_014365bf;
  case 8:
    switch(leftValue) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 7:
      break;
    default:
      goto switchD_0143668e_default;
    case 8:
      *value = (uint)((BOOL *)dblLeft == value_local);
      pJVar17 = UnsafeVarTo<Js::JavascriptSymbol>((Var)dblLeft);
      pPVar18 = JavascriptSymbol::GetValue(pJVar17);
      pJVar17 = UnsafeVarTo<Js::JavascriptSymbol>(value_local);
      pPVar19 = JavascriptSymbol::GetValue(pJVar17);
      if ((uint)(pPVar18 == pPVar19) == *value) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x2e1,
                                  "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value)"
                                  ,
                                  "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    case 0x40:
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbolObject>(value_local);
      pvVar16 = JavascriptSymbolObject::Unwrap(pJVar15);
      *value = (uint)((Var)dblLeft == pvVar16);
      pJVar17 = UnsafeVarTo<Js::JavascriptSymbol>((Var)dblLeft);
      pPVar18 = JavascriptSymbol::GetValue(pJVar17);
      pJVar15 = UnsafeVarTo<Js::JavascriptSymbolObject>(value_local);
      pPVar19 = JavascriptSymbolObject::GetValue(pJVar15);
      if ((uint)(pPVar18 == pPVar19) == *value) {
        return 1;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                  ,0x2e5,
                                  "((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value)"
                                  ,
                                  "(UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
      return 1;
    }
    goto LAB_01437560;
  default:
    goto switchD_014365f9_caseD_9;
  case 0x1b:
    if (leftValue == 0x1b) goto LAB_01437560;
switchD_014365f9_caseD_9:
    if ((uint)leftValue < 2) {
      pTVar20 = Memory::WriteBarrierPtr<Js::Type>::operator->(&this->type);
      BVar3 = Js::Type::IsFalsy(pTVar20);
      *value = BVar3;
      return 1;
    }
    if ((2 < leftValue - 2U) && (1 < leftValue - 7U)) goto LAB_01437560;
  }
  dblLeft = (double)JavascriptConversion::ToPrimitive<(Js::JavascriptHint)0>
                              ((Var)dblLeft,requestContext);
  if ((Var)dblLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is((Var)dblLeft);
  if (bVar2) {
    local_30 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck((Var)dblLeft);
    if (bVar2) {
      local_30 = TypeIds_Number;
    }
    else {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>((Var)dblLeft);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_30 = GetTypeId(pRVar7);
      if ((0x57 < (int)local_30) && (BVar3 = IsExternal(pRVar7), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  redoCount = local_30;
  rightValue._4_4_ = rightValue._4_4_ + 1;
  goto LAB_014365bf;
}

Assistant:

BOOL RecyclableObject::Equals(__in Var aRight, __out BOOL* value, ScriptContext * requestContext)
    {
        Var aLeft = this;
        if (aLeft == aRight)
        {
            *value = TRUE;
            return TRUE;
        }

        double dblLeft, dblRight;
        TypeId leftType = this->GetTypeId();
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        int redoCount = 0;

    Redo:
        if (redoCount == 2)
        {
            goto ReturnFalse;
        }

        switch (leftType)
        {
        case TypeIds_Undefined:
        case TypeIds_Null:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Undefined:
            case TypeIds_Null:
                goto ReturnTrue;
            default:
                // Falsy objects are == null and == undefined.
                *value = VarTo<RecyclableObject>(aRight)->GetType()->IsFalsy();
                return TRUE;
            }
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                // We already did a check to see if aLeft == aRight above, but we need to check again in case there was a redo.
                *value = aLeft == aRight;
                return TRUE;
            case TypeIds_Int64Number:
            {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/*leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = TaggedInt::ToDouble(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                *value = leftValue == rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                __int64 leftValue = VarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* leftValue >= 0 && */(unsigned __int64)leftValue == rightValue);
                return TRUE;
            }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                // TODO: yongqu to review whether we need to check for neg value
                *value = rightValue >= 0 && leftValue == (unsigned __int64)rightValue;
                Assert(!(*value));  // currently it cannot be true. more for future extension if we allow arithmetic calculation
                return TRUE;
            }
            case TypeIds_Number:
                dblLeft = (double)VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Int64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                // TODO: yongqu to review whether we need to check for neg value
                *value = (/* rightValue >= 0 && */leftValue == (unsigned __int64)rightValue);
                return TRUE;
            }
            case TypeIds_UInt64Number:
            {
                unsigned __int64 leftValue = VarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptUInt64Number>(aRight)->GetValue();
                *value = leftValue == rightValue;
                return TRUE;
            }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Integer:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = TaggedInt::ToDouble(aRight);
                goto CompareDoubles;
            case TypeIds_Number:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptNumber::GetValue(aRight);
                goto CompareDoubles;
            case TypeIds_Boolean:
            case TypeIds_String:
                dblLeft = JavascriptNumber::GetValue(aLeft);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_String:
                *value = JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_Boolean:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
        case TypeIds_Boolean:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Symbol:
                goto ReturnFalse;
            case TypeIds_Boolean:
                *value = VarTo<JavascriptBoolean>(aLeft)->GetValue() == VarTo<JavascriptBoolean>(aRight)->GetValue();
                return TRUE;
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
                dblLeft = JavascriptConversion::ToNumber(aLeft, requestContext);
                dblRight = JavascriptConversion::ToNumber(aRight, requestContext);
                goto CompareDoubles;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Symbol:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
            case TypeIds_Number:
            case TypeIds_Integer:
            case TypeIds_String:
            case TypeIds_Boolean:
                goto ReturnFalse;
            case TypeIds_Symbol:
                *value = (aLeft == aRight);
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbol>(aRight)->GetValue()) == *value);
                return TRUE;
            case TypeIds_SymbolObject:
                *value = (aLeft == UnsafeVarTo<JavascriptSymbolObject>(aRight)->Unwrap());
                Assert((UnsafeVarTo<JavascriptSymbol>(aLeft)->GetValue() == UnsafeVarTo<JavascriptSymbolObject>(aRight)->GetValue()) == *value);
                return TRUE;
            default:
                goto RedoRight;
            }
            break;

        case TypeIds_Function:
            if (rightType == TypeIds_Function)
            {
                goto ReturnFalse;
            }
            // Fall through to do normal object comparison on function object.
        default:
            switch (rightType)
            {
            case TypeIds_Undefined:
            case TypeIds_Null:
                // Falsy objects are == null and == undefined.
                *value = this->type->IsFalsy();
                return TRUE;
            case TypeIds_Boolean:
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_String:
            case TypeIds_Symbol:
                goto RedoLeft;
            default:
                goto ReturnFalse;
            }
        }

    RedoLeft:
        aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aLeft, requestContext);
        leftType = JavascriptOperators::GetTypeId(aLeft);
        redoCount++;
        goto Redo;
    RedoRight:
        aRight = JavascriptConversion::ToPrimitive<JavascriptHint::None>(aRight, requestContext);
        rightType = JavascriptOperators::GetTypeId(aRight);
        redoCount++;
        goto Redo;
    CompareDoubles:
        *value = dblLeft == dblRight;
        return TRUE;
    ReturnFalse:
        *value = FALSE;
        return TRUE;
    ReturnTrue:
        *value = TRUE;
        return TRUE;
    }